

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatterSPH.cpp
# Opt level: O3

void __thiscall chrono::ChMatterSPH::VariablesFbLoadForces(ChMatterSPH *this,double factor)

{
  long *plVar1;
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [16];
  ChSystem *pCVar4;
  pointer psVar5;
  element_type *peVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar7;
  bool bVar8;
  byte bVar9;
  undefined8 uVar10;
  ChProximityContainerSPH *this_01;
  pointer psVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  uint uVar17;
  pointer psVar18;
  ulong uVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  double dVar24;
  double dVar25;
  long in_XMM0_Qb;
  ChVector<double> v;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  double local_c8 [3];
  long lStack_b0;
  double dStack_a8;
  long lStack_a0;
  long lStack_98;
  undefined1 (*pauStack_90) [64];
  long local_88;
  undefined1 local_78 [16];
  double dStack_68;
  double dStack_60;
  
  pCVar4 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
  psVar18 = (pCVar4->assembly).otherphysicslist.
            super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (pCVar4->assembly).otherphysicslist.
           super__Vector_base<std::shared_ptr<chrono::ChPhysicsItem>,_std::allocator<std::shared_ptr<chrono::ChPhysicsItem>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78._0_8_ = psVar5;
  dStack_a8 = factor;
  if (psVar18 != psVar5) {
    p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lStack_a0 = in_XMM0_Qb;
    do {
      peVar6 = (psVar18->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      this_00 = (psVar18->super___shared_ptr<chrono::ChPhysicsItem,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if (peVar6 == (element_type *)0x0) {
        local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_01 = (ChProximityContainerSPH *)0x0;
      }
      else {
        this_01 = (ChProximityContainerSPH *)
                  __dynamic_cast(peVar6,&ChPhysicsItem::typeinfo,&ChProximityContainerSPH::typeinfo,
                                 0);
        if (this_01 == (ChProximityContainerSPH *)0x0 ||
            this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          local_d0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          local_d0 = this_00;
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
      }
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      dVar24 = DAT_00b689a8;
      dVar25 = DAT_00b689a0;
      uVar10 = VNULL;
      if (this_01 != (ChProximityContainerSPH *)0x0) {
        psVar11 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        lVar13 = (long)(this->nodes).
                       super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar11;
        if (lVar13 != 0) {
          uVar17 = 1;
          do {
            peVar7 = (psVar11->super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
            if (peVar7 != (element_type *)Q_ROTATE_X_TO_Z) {
              (peVar7->UserForce).m_data[0] = (double)uVar10;
              *(double *)((long)&peVar7->UserForce + 8) = dVar25;
              *(double *)((long)&peVar7->UserForce + 0x10) = dVar24;
            }
            peVar7->density = 0.0;
            uVar19 = (ulong)uVar17;
            psVar11 = psVar11 + 1;
            uVar17 = uVar17 + 1;
          } while (uVar19 < (ulong)(lVar13 >> 4));
        }
        ChProximityContainerSPH::AccumulateStep1(this_01);
        psVar11 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->nodes).
            super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
            ._M_impl.super__Vector_impl_data._M_finish != psVar11) {
          uVar19 = 0;
          uVar14 = 1;
          do {
            peVar7 = psVar11[uVar19].
                     super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var16 = psVar11[uVar19].
                      super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                      _M_pi;
            if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              }
            }
            if (peVar7 == (element_type *)0x0) {
              __assert_fail("mnode",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                            ,0x1f8,"virtual void chrono::ChMatterSPH::VariablesFbLoadForces(double)"
                           );
            }
            dVar25 = peVar7->density;
            dVar24 = 0.0;
            if ((dVar25 != 0.0) || (NAN(dVar25))) {
              dVar24 = (double)(**(code **)((long)(peVar7->super_ChNodeXYZ).super_ChLoadableUVW +
                                           0x90))(peVar7);
              dVar25 = peVar7->density;
              dVar24 = dVar24 / dVar25;
            }
            peVar7->volume = dVar24;
            peVar7->pressure =
                 (dVar25 - (this->material).super_ChContinuumMaterial.density) *
                 (this->material).pressure_stiffness;
            if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
            }
            psVar11 = (this->nodes).
                      super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            bVar8 = uVar14 < (ulong)((long)(this->nodes).
                                           super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)psVar11 >> 4);
            uVar19 = uVar14;
            uVar14 = (ulong)((int)uVar14 + 1);
          } while (bVar8);
        }
        ChProximityContainerSPH::AccumulateStep2(this_01);
        psVar11 = (this->nodes).
                  super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((this->nodes).
            super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
            ._M_impl.super__Vector_impl_data._M_finish == psVar11) goto LAB_0053a0d9;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = dStack_a8;
        _local_78 = vbroadcastsd_avx512f(auVar3);
        uVar17 = 1;
        uVar19 = 0;
        do {
          pCVar4 = (this->super_ChIndexedNodes).super_ChPhysicsItem.system;
          dVar25 = (double)(**(code **)((long)((psVar11[uVar19].
                                                super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr)->super_ChNodeXYZ).super_ChLoadableUVW + 0x90
                                       ))();
          psVar11 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          peVar7 = psVar11[uVar19].super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          local_c8[0] = dVar25 * (pCVar4->G_acc).m_data[0] + (peVar7->UserForce).m_data[0];
          local_c8[1] = dVar25 * (pCVar4->G_acc).m_data[1] +
                        *(double *)((long)&peVar7->UserForce + 8);
          local_c8[2] = dVar25 * (pCVar4->G_acc).m_data[2] +
                        *(double *)((long)&peVar7->UserForce + 0x10);
          p_Var16 = psVar11[uVar19].
                    super___shared_ptr<chrono::ChNodeSPH,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          ChVariables::Get_fb((ChVectorRef *)&pauStack_90,&(peVar7->variables).super_ChVariables);
          if (local_88 != 3) {
            __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                          "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                          "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 3, 1>>, const Eigen::Map<Eigen::Matrix<double, 3, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                         );
          }
          uVar12 = 3;
          if (((ulong)pauStack_90 & 7) == 0) {
            uVar15 = -((uint)((ulong)pauStack_90 >> 3) & 0x1fffffff) & 7;
            if (uVar15 < 3) {
              uVar12 = uVar15;
            }
            if (uVar15 != 0) goto LAB_0053a027;
          }
          else {
LAB_0053a027:
            auVar21 = vpbroadcastq_avx512f();
            uVar19 = vpcmpuq_avx512f(auVar21,_DAT_0095b800,5);
            bVar9 = (byte)uVar19;
            auVar21._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * (long)local_c8[1];
            auVar21._0_8_ = (ulong)(bVar9 & 1) * (long)local_c8[0];
            auVar21._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * (long)local_c8[2];
            auVar21._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * lStack_b0;
            auVar21._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * (long)dStack_a8;
            auVar21._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * lStack_a0;
            auVar21._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * lStack_98;
            auVar21._56_8_ = (uVar19 >> 7) * (long)pauStack_90;
            auVar22._8_8_ = (ulong)((byte)(uVar19 >> 1) & 1) * *(long *)(*pauStack_90 + 8);
            auVar22._0_8_ = (ulong)(bVar9 & 1) * *(long *)*pauStack_90;
            auVar22._16_8_ = (ulong)((byte)(uVar19 >> 2) & 1) * *(long *)(*pauStack_90 + 0x10);
            auVar22._24_8_ = (ulong)((byte)(uVar19 >> 3) & 1) * *(long *)(*pauStack_90 + 0x18);
            auVar22._32_8_ = (ulong)((byte)(uVar19 >> 4) & 1) * *(long *)(*pauStack_90 + 0x20);
            auVar22._40_8_ = (ulong)((byte)(uVar19 >> 5) & 1) * *(long *)(*pauStack_90 + 0x28);
            auVar22._48_8_ = (ulong)((byte)(uVar19 >> 6) & 1) * *(long *)(*pauStack_90 + 0x30);
            auVar22._56_8_ = (uVar19 >> 7) * *(long *)(*pauStack_90 + 0x38);
            auVar21 = vmulpd_avx512f(auVar21,_local_78);
            auVar21 = vaddpd_avx512f(auVar21,auVar22);
            auVar23._0_8_ =
                 (ulong)(bVar9 & 1) * auVar21._0_8_ |
                 (ulong)!(bool)(bVar9 & 1) * *(long *)*pauStack_90;
            bVar8 = (bool)((byte)(uVar19 >> 1) & 1);
            auVar23._8_8_ =
                 (ulong)bVar8 * auVar21._8_8_ | (ulong)!bVar8 * *(long *)(*pauStack_90 + 8);
            bVar8 = (bool)((byte)(uVar19 >> 2) & 1);
            auVar23._16_8_ =
                 (ulong)bVar8 * auVar21._16_8_ | (ulong)!bVar8 * *(long *)(*pauStack_90 + 0x10);
            bVar8 = (bool)((byte)(uVar19 >> 3) & 1);
            auVar23._24_8_ =
                 (ulong)bVar8 * auVar21._24_8_ | (ulong)!bVar8 * *(long *)(*pauStack_90 + 0x18);
            bVar8 = (bool)((byte)(uVar19 >> 4) & 1);
            auVar23._32_8_ =
                 (ulong)bVar8 * auVar21._32_8_ | (ulong)!bVar8 * *(long *)(*pauStack_90 + 0x20);
            bVar8 = (bool)((byte)(uVar19 >> 5) & 1);
            auVar23._40_8_ =
                 (ulong)bVar8 * auVar21._40_8_ | (ulong)!bVar8 * *(long *)(*pauStack_90 + 0x28);
            bVar8 = (bool)((byte)(uVar19 >> 6) & 1);
            auVar23._48_8_ =
                 (ulong)bVar8 * auVar21._48_8_ | (ulong)!bVar8 * *(long *)(*pauStack_90 + 0x30);
            auVar23._56_8_ =
                 (uVar19 >> 7) * auVar21._56_8_ |
                 (ulong)!SUB81(uVar19 >> 7,0) * *(long *)(*pauStack_90 + 0x38);
            *pauStack_90 = auVar23;
          }
          if (uVar12 < 3) {
            uVar14 = (ulong)(uVar12 << 3);
            auVar20 = vpbroadcastq_avx512vl();
            uVar19 = vpcmpuq_avx512vl(auVar20,_DAT_00955380,5);
            uVar19 = uVar19 & 0xf;
            bVar9 = (byte)uVar19;
            plVar1 = (long *)(*pauStack_90 + uVar14);
            pauVar2 = (undefined1 (*) [32])(*pauStack_90 + uVar14);
            auVar20._0_8_ =
                 (ulong)(bVar9 & 1) *
                 (long)((double)((ulong)(bVar9 & 1) * *(long *)((long)local_c8 + uVar14)) *
                        (double)local_78._0_8_ + (double)((ulong)(bVar9 & 1) * *plVar1)) |
                 (ulong)!(bool)(bVar9 & 1) * *(long *)*pauVar2;
            bVar8 = (bool)((byte)(uVar19 >> 1) & 1);
            auVar20._8_8_ =
                 (ulong)bVar8 *
                 (long)((double)((ulong)((byte)(uVar19 >> 1) & 1) *
                                *(long *)((long)local_c8 + uVar14 + 8)) * (double)local_78._8_8_ +
                       (double)((ulong)((byte)(uVar19 >> 1) & 1) * plVar1[1])) |
                 (ulong)!bVar8 * *(long *)(*pauVar2 + 8);
            bVar8 = (bool)((byte)(uVar19 >> 2) & 1);
            auVar20._16_8_ =
                 (ulong)bVar8 *
                 (long)((double)((ulong)((byte)(uVar19 >> 2) & 1) *
                                *(long *)((long)local_c8 + uVar14 + 0x10)) * dStack_68 +
                       (double)((ulong)((byte)(uVar19 >> 2) & 1) * plVar1[2])) |
                 (ulong)!bVar8 * *(long *)(*pauVar2 + 0x10);
            auVar20._24_8_ =
                 (uVar19 >> 3) *
                 (long)((double)((uVar19 >> 3) * *(long *)((long)&lStack_b0 + uVar14)) * dStack_60 +
                       (double)((uVar19 >> 3) * plVar1[3])) |
                 (ulong)!SUB81(uVar19 >> 3,0) * *(long *)(*pauVar2 + 0x18);
            *pauVar2 = auVar20;
          }
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          psVar11 = (this->nodes).
                    super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          uVar19 = (ulong)uVar17;
          uVar17 = uVar17 + 1;
          if ((ulong)((long)(this->nodes).
                            super__Vector_base<std::shared_ptr<chrono::ChNodeSPH>,_std::allocator<std::shared_ptr<chrono::ChNodeSPH>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >> 4) <=
              uVar19) {
LAB_0053a0d9:
            if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
            }
            return;
          }
        } while( true );
      }
      psVar18 = psVar18 + 1;
      p_Var16 = local_d0;
    } while (psVar18 != (pointer)local_78._0_8_);
  }
  __assert_fail("edges",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/physics/ChMatterSPH.cpp"
                ,0x1e5,"virtual void chrono::ChMatterSPH::VariablesFbLoadForces(double)");
}

Assistant:

void ChMatterSPH::VariablesFbLoadForces(double factor) {
    // COMPUTE THE SPH FORCES HERE

    // First, find if any ChProximityContainerSPH object is present in the system

    std::shared_ptr<ChProximityContainerSPH> edges;
    for (auto otherphysics : GetSystem()->Get_otherphysicslist()) {
        if ((edges = std::dynamic_pointer_cast<ChProximityContainerSPH>(otherphysics)))
            break;
    }
    assert(edges);  // If using a ChMatterSPH, you must add also a ChProximityContainerSPH.
    if (!edges)
        return;

    // 1- Per-node initialization

    for (unsigned int j = 0; j < nodes.size(); j++) {
        nodes[j]->UserForce = VNULL;
        nodes[j]->density = 0;
    }

    // 2- Per-edge initialization and accumulation of particles's density

    edges->AccumulateStep1();

    // 3- Per-node volume and pressure computation

    for (unsigned int j = 0; j < nodes.size(); j++) {
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        // node volume is v=mass/density
        if (mnode->density)
            mnode->volume = mnode->GetMass() / mnode->density;
        else
            mnode->volume = 0;

        // node pressure = k(dens - dens_0);
        mnode->pressure = material.Get_pressure_stiffness() * (mnode->density - material.Get_density());
    }

    // 4- Per-edge forces computation and accumulation

    edges->AccumulateStep2();

    // 5- Per-node load forces

    for (unsigned int j = 0; j < nodes.size(); j++) {
        // particle gyroscopic force:
        // none.

        // add gravity
        ChVector<> Gforce = GetSystem()->Get_G_acc() * nodes[j]->GetMass();
        ChVector<> TotForce = nodes[j]->UserForce + Gforce;

        // downcast
        std::shared_ptr<ChNodeSPH> mnode(nodes[j]);
        assert(mnode);

        mnode->variables.Get_fb() += factor * TotForce.eigen();
    }
}